

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

s32 __thiscall irr::gui::CGUITabControl::getTabAt(CGUITabControl *this,s32 xpos,s32 ypos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  pointer ppIVar5;
  undefined8 uVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  
  plVar4 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x30))(plVar4,0);
  if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
    iVar7 = *(int *)&this->field_0x44 + 2;
    iVar1 = this->TabHeight + iVar7;
  }
  else {
    iVar1 = *(int *)&this->field_0x4c;
    iVar7 = iVar1 - this->TabHeight;
  }
  if ((((*(int *)&this->field_0x40 <= xpos) && (iVar7 <= ypos)) &&
      (xpos <= *(int *)&this->field_0x48)) && (ypos <= iVar1)) {
    uVar9 = this->CurrentScrollTabIndex;
    ppIVar5 = (this->Tabs).m_data.
              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)uVar9 <
        (int)((ulong)((long)(this->Tabs).m_data.
                            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5) >> 3)) {
      iVar1 = *(int *)&this->field_0x40 + 2;
      do {
        if (ppIVar5[uVar9] == (IGUITab *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (**(code **)(*(long *)&(ppIVar5[uVar9]->super_IGUIElement).super_IEventReceiver +
                              0xa8))();
        }
        if (plVar4 == (long *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar2 = (**(code **)(*plVar4 + 8))(plVar4,uVar6);
          iVar2 = iVar2 + this->TabExtraWidth;
          iVar3 = this->TabMaxWidth;
          iVar7 = iVar3;
          if (iVar2 < iVar3) {
            iVar7 = iVar2;
          }
          if (iVar3 < 1) {
            iVar7 = iVar2;
          }
        }
        if (this->ScrollControl == true) {
          iVar3 = ((this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X - iVar1) + -2;
          bVar8 = iVar3 < iVar7;
          if (iVar3 < iVar7) {
            iVar7 = iVar3;
          }
        }
        else {
          bVar8 = false;
        }
        if (iVar1 <= xpos && xpos <= iVar7 + iVar1) {
          return uVar9;
        }
        uVar9 = uVar9 + 1;
        ppIVar5 = (this->Tabs).m_data.
                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        iVar1 = iVar7 + iVar1;
      } while ((int)uVar9 <
               (int)((ulong)((long)(this->Tabs).m_data.
                                   super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5) >> 3)
               && !bVar8);
    }
  }
  return 0xffffffff;
}

Assistant:

s32 CGUITabControl::getTabAt(s32 xpos, s32 ypos) const
{
	core::position2di p(xpos, ypos);
	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = skin->getFont();

	core::rect<s32> frameRect(AbsoluteRect);

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight;
	}

	s32 pos = frameRect.UpperLeftCorner.X + 2;

	if (!frameRect.isPointInside(p))
		return -1;

	bool abort = false;
	for (s32 i = CurrentScrollTabIndex; i < (s32)Tabs.size() && !abort; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			// TODO: merge this with draw() ?
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				abort = true;
				len = space;
			}
		}

		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if (frameRect.isPointInside(p)) {
			return i;
		}
	}
	return -1;
}